

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::Vector<capnp::(anonymous_namespace)::CapnpcCppMain::NodeText>::~Vector
          (Vector<capnp::(anonymous_namespace)::CapnpcCppMain::NodeText> *this)

{
  NodeText *pNVar1;
  RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::NodeText> *pRVar2;
  NodeText *pNVar3;
  ArrayDisposer *pAVar4;
  
  pNVar1 = (this->builder).ptr;
  if (pNVar1 != (NodeText *)0x0) {
    pRVar2 = (this->builder).pos;
    pNVar3 = (this->builder).endPtr;
    (this->builder).ptr = (NodeText *)0x0;
    (this->builder).pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::NodeText> *)0x0;
    (this->builder).endPtr = (NodeText *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pNVar1,0x1c0,((long)pRVar2 - (long)pNVar1 >> 6) * 0x6db6db6db6db6db7,
               ((long)pNVar3 - (long)pNVar1 >> 6) * 0x6db6db6db6db6db7,
               ArrayDisposer::Dispose_<capnp::(anonymous_namespace)::CapnpcCppMain::NodeText>::
               destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }